

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst-timerfd.c
# Opt level: O0

void dotest(int clockid)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  ssize_t sVar4;
  int64_t iVar5;
  timespec tVar6;
  timespec tVar7;
  undefined1 local_618 [8];
  itimerspec t9;
  itimerspec tout;
  itimerspec t8;
  undefined1 local_598 [8];
  itimerspec t7;
  itimerspec t6;
  pthread_t th2;
  undefined1 local_530 [8];
  itimerspec t5;
  itimerspec t46;
  timespec after;
  timespec before;
  itimerspec t45;
  itimerspec t4;
  itimerspec t3;
  itimerspec t2;
  uint64_t counter;
  itimerspec t1;
  char buf [1024];
  pollfd local_1c;
  pollfd pfd;
  int junk;
  int fd;
  int clockid_local;
  
  piVar3 = __errno_location();
  *piVar3 = 0;
  pfd._4_4_ = timerfd_create(clockid,0x800);
  if ((int)pfd._4_4_ < 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_create(clockid, TFD_NONBLOCK)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0x9e);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_create(clockid, TFD_NONBLOCK) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0x9e);
    abort();
  }
  local_1c.fd._0_2_ = pfd.events;
  local_1c.fd._2_2_ = pfd.revents;
  local_1c.events = 1;
  local_1c.revents = 0;
  iVar2 = poll(&local_1c,1,0);
  if (iVar2 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0","poll(&pfd, 1, 0)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xa3);
    abort();
  }
  sVar4 = read(pfd._4_4_,&t1.it_value.tv_nsec,0x400);
  if (sVar4 != -1) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","-1",
            "read(fd, buf, sizeof(buf))",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xa5);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0xb) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","EAGAIN",
            "read(fd, buf, sizeof(buf)) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xa5);
    abort();
  }
  sVar4 = read(pfd._4_4_,&t1.it_value.tv_nsec,7);
  if (sVar4 != -1) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","-1","read(fd, buf, 7)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xa7);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0x16) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","EINVAL",
            "read(fd, buf, 7) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xa7);
    abort();
  }
  counter = 0;
  t1.it_interval.tv_sec = 0;
  t1.it_interval.tv_nsec = 0;
  t1.it_value.tv_sec = 500000000;
  piVar3 = __errno_location();
  *piVar3 = 0;
  pfd.fd = timerfd_settime(pfd._4_4_,0,(itimerspec *)&counter,(itimerspec *)0x0);
  if (pfd.fd < 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_settime(fd, 0, &t1, NULL)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xab);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_settime(fd, 0, &t1, NULL) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xab);
    abort();
  }
  sVar4 = read(pfd._4_4_,&t1.it_value.tv_nsec,0x400);
  if (sVar4 != -1) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","-1",
            "read(fd, buf, sizeof(buf))",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xad);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0xb) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","EAGAIN",
            "read(fd, buf, sizeof(buf)) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xad);
    abort();
  }
  sleep(1);
  sVar4 = read(pfd._4_4_,&t2.it_value.tv_nsec,8);
  if (sVar4 != 8) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(ssize_t)8",
            "read(fd, &counter, sizeof(counter))",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xb2);
    abort();
  }
  if (t2.it_value.tv_nsec != 1) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(u64)1","counter",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xb3);
    abort();
  }
  sVar4 = read(pfd._4_4_,&t2.it_value.tv_nsec,8);
  if (sVar4 != -1) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","-1",
            "read(fd, &counter, sizeof(counter))",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xb4);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0xb) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","EAGAIN",
            "read(fd, &counter, sizeof(counter)) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xb4);
    abort();
  }
  t3.it_value.tv_nsec = 0;
  t2.it_interval.tv_sec = 200000000;
  t2.it_interval.tv_nsec = 0;
  t2.it_value.tv_sec = 300000000;
  piVar3 = __errno_location();
  *piVar3 = 0;
  pfd.fd = timerfd_settime(pfd._4_4_,0,(itimerspec *)&t3.it_value.tv_nsec,(itimerspec *)0x0);
  if (pfd.fd < 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_settime(fd, 0, &t2, NULL)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xbc);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_settime(fd, 0, &t2, NULL) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xbc);
    abort();
  }
  sVar4 = read(pfd._4_4_,&t1.it_value.tv_nsec,0x400);
  if (sVar4 != -1) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","-1",
            "read(fd, buf, sizeof(buf))",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xbd);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0xb) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","EAGAIN",
            "read(fd, buf, sizeof(buf)) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xbd);
    abort();
  }
  iVar2 = usleep(400000);
  if (iVar2 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0","usleep(400000)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xbe);
    abort();
  }
  iVar2 = poll(&local_1c,1,0);
  if (iVar2 != 1) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","1","poll(&pfd, 1, 0)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xc2);
    abort();
  }
  if (local_1c.revents != 1) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","POLLIN","(int)pfd.revents",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xc4);
    abort();
  }
  iVar2 = usleep(400000);
  if (iVar2 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0","usleep(400000)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xc5);
    abort();
  }
  iVar2 = poll(&local_1c,1,0);
  if (iVar2 != 1) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","1","poll(&pfd, 1, 0)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xc9);
    abort();
  }
  if (local_1c.revents != 1) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","POLLIN","(int)pfd.revents",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xcb);
    abort();
  }
  sVar4 = read(pfd._4_4_,&t2.it_value.tv_nsec,8);
  if (sVar4 != 8) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(ssize_t)8",
            "read(fd, &counter, sizeof(counter))",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xcc);
    abort();
  }
  if ((ulong)t2.it_value.tv_nsec < 3) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(u64)3","counter",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xcd);
    abort();
  }
  if (t2.it_value.tv_nsec != 3) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(u64)3","counter",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xcf);
    abort();
  }
  sVar4 = read(pfd._4_4_,&t2.it_value.tv_nsec,8);
  if (sVar4 != -1) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","-1",
            "read(fd, &counter, sizeof(counter))",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xd1);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0xb) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","EAGAIN",
            "read(fd, &counter, sizeof(counter)) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xd1);
    abort();
  }
  usleep(400000);
  iVar2 = poll(&local_1c,1,0);
  if (iVar2 != 1) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","1","poll(&pfd, 1, 0)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xd6);
    abort();
  }
  memset(&t4.it_value.tv_nsec,0,0x20);
  piVar3 = __errno_location();
  *piVar3 = 0;
  pfd.fd = timerfd_settime(pfd._4_4_,0,(itimerspec *)&t4.it_value.tv_nsec,(itimerspec *)0x0);
  if (pfd.fd < 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_settime(fd, 0, &t3, NULL)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xd8);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_settime(fd, 0, &t3, NULL) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xd8);
    abort();
  }
  iVar2 = poll(&local_1c,1,0);
  if (iVar2 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0","poll(&pfd, 1, 0)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xd9);
    abort();
  }
  usleep(400000);
  iVar2 = poll(&local_1c,1,0);
  if (iVar2 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0","poll(&pfd, 1, 0)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xdb);
    abort();
  }
  memset(&t45.it_value.tv_nsec,0,0x20);
  clock_gettime(clockid,(timespec *)&t4.it_interval.tv_nsec);
  lVar1 = t4.it_value.tv_sec + 300000000;
  if (999999999 < t4.it_value.tv_sec + 300000000) {
    t4.it_interval.tv_nsec = t4.it_interval.tv_nsec + 1;
    lVar1 = t4.it_value.tv_sec + -700000000;
  }
  t4.it_value.tv_sec = lVar1;
  piVar3 = __errno_location();
  *piVar3 = 0;
  pfd.fd = timerfd_settime(pfd._4_4_,1,(itimerspec *)&t45.it_value.tv_nsec,(itimerspec *)0x0);
  if (pfd.fd < 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_settime(fd, TFD_TIMER_ABSTIME, &t4, NULL)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xe6);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_settime(fd, TFD_TIMER_ABSTIME, &t4, NULL) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xe6);
    abort();
  }
  sVar4 = read(pfd._4_4_,&t1.it_value.tv_nsec,0x400);
  if (sVar4 != -1) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","-1",
            "read(fd, buf, sizeof(buf))",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xe7);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0xb) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","EAGAIN",
            "read(fd, buf, sizeof(buf)) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xe7);
    abort();
  }
  usleep(500000);
  sVar4 = read(pfd._4_4_,&t2.it_value.tv_nsec,8);
  if (sVar4 != 8) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(ssize_t)8",
            "read(fd, &counter, sizeof(counter))",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xe9);
    abort();
  }
  if (t2.it_value.tv_nsec != 1) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(u64)1","counter",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xea);
    abort();
  }
  sVar4 = read(pfd._4_4_,&t2.it_value.tv_nsec,8);
  if (sVar4 != -1) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","-1",
            "read(fd, &counter, sizeof(counter))",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xeb);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0xb) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","EAGAIN",
            "read(fd, &counter, sizeof(counter)) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xeb);
    abort();
  }
  before.tv_nsec = 0;
  t45.it_interval.tv_sec = 0;
  t45.it_interval.tv_nsec = 0;
  t45.it_value.tv_sec = 400000000;
  piVar3 = __errno_location();
  *piVar3 = 0;
  pfd.fd = timerfd_settime(pfd._4_4_,0,(itimerspec *)&before.tv_nsec,(itimerspec *)0x0);
  if (pfd.fd < 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_settime(fd, 0, &t45, NULL)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xf0);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_settime(fd, 0, &t45, NULL) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xf0);
    abort();
  }
  tVar6 = steady_clock_now();
  iVar2 = poll(&local_1c,1,0);
  if (iVar2 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0","poll(&pfd, 1, 0)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xf2);
    abort();
  }
  iVar2 = poll(&local_1c,1,100);
  if (iVar2 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0","poll(&pfd, 1, 100 )",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xf3);
    abort();
  }
  iVar2 = poll(&local_1c,1,1000);
  if (iVar2 != 1) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","1","poll(&pfd, 1, 1000 )",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xf4);
    abort();
  }
  tVar7 = steady_clock_now();
  iVar5 = nano_diff(tVar7,tVar6);
  if (iVar5 < 300000000) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(int64_t)MS_TO_NSEC(300)",
            "nano_diff(after, before)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xf6);
    abort();
  }
  piVar3 = __errno_location();
  *piVar3 = 0;
  pfd.fd = close(pfd._4_4_);
  if (pfd.fd < 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0","close(fd)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xf9);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0","close(fd) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xf9);
    abort();
  }
  piVar3 = __errno_location();
  *piVar3 = 0;
  pfd._4_4_ = timerfd_create(0,0);
  if ((int)pfd._4_4_ < 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_create(CLOCK_REALTIME, 0)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xfd);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_create(CLOCK_REALTIME, 0) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0xfd);
    abort();
  }
  local_1c.fd._0_2_ = pfd.events;
  local_1c.fd._2_2_ = pfd.revents;
  t5.it_value.tv_nsec = 0;
  piVar3 = __errno_location();
  *piVar3 = 0;
  pfd.fd = timerfd_settime(pfd._4_4_,0,(itimerspec *)&t5.it_value.tv_nsec,(itimerspec *)0x0);
  if (pfd.fd < 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_settime(fd, 0, &t46, NULL)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0x100);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_settime(fd, 0, &t46, NULL) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0x100);
    abort();
  }
  iVar2 = poll(&local_1c,1,0);
  if (iVar2 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0","poll(&pfd, 1, 0)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0x101);
    abort();
  }
  piVar3 = __errno_location();
  *piVar3 = 0;
  pfd.fd = close(pfd._4_4_);
  if (pfd.fd < 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0","close(fd)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0x102);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0","close(fd) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0x102);
    abort();
  }
  piVar3 = __errno_location();
  *piVar3 = 0;
  pfd._4_4_ = timerfd_create(0,0);
  if ((int)pfd._4_4_ < 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_create(CLOCK_REALTIME, 0)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0x105);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_create(CLOCK_REALTIME, 0) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0x105);
    abort();
  }
  local_1c.fd._0_2_ = pfd.events;
  local_1c.fd._2_2_ = pfd.revents;
  local_530 = (undefined1  [8])0x0;
  t5.it_interval.tv_sec = 0;
  t5.it_interval.tv_nsec = 0;
  t5.it_value.tv_sec = 500000000;
  piVar3 = __errno_location();
  *piVar3 = 0;
  pfd.fd = timerfd_settime(pfd._4_4_,0,(itimerspec *)local_530,(itimerspec *)0x0);
  if (pfd.fd < 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_settime(fd, 0, &t5, NULL)",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0x10a);
    abort();
  }
  piVar3 = __errno_location();
  if (*piVar3 != 0) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
            "timerfd_settime(fd, 0, &t5, NULL) errno",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0x10a);
    abort();
  }
  tVar6 = steady_clock_now();
  sVar4 = read(pfd._4_4_,&t2.it_value.tv_nsec,8);
  if (sVar4 != 8) {
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(ssize_t)8",
            "read(fd, &counter, sizeof(counter))",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0x10c);
    abort();
  }
  if (t2.it_value.tv_nsec == 1) {
    tVar7 = steady_clock_now();
    iVar5 = nano_diff(tVar7,tVar6);
    if (iVar5 < 400000000) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(int64_t)MS_TO_NSEC(400)",
              "nano_diff(after, before)",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x10f);
      abort();
    }
    iVar2 = pthread_create((pthread_t *)&t6.it_value.tv_nsec,(pthread_attr_t *)0x0,th2_func,
                           &pfd.events);
    if (iVar2 != 0) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
              "pthread_create(&th2, NULL, th2_func, &fd)",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x113);
      abort();
    }
    usleep(400000);
    t7.it_value.tv_nsec = 0;
    t6.it_interval.tv_sec = 0;
    t6.it_interval.tv_nsec = 0;
    t6.it_value.tv_sec = 200000000;
    piVar3 = __errno_location();
    *piVar3 = 0;
    pfd.fd = timerfd_settime(pfd._4_4_,0,(itimerspec *)&t7.it_value.tv_nsec,(itimerspec *)0x0);
    if (pfd.fd < 0) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
              "timerfd_settime(fd, 0, &t6, NULL)",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x116);
      abort();
    }
    piVar3 = __errno_location();
    if (*piVar3 != 0) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
              "timerfd_settime(fd, 0, &t6, NULL) errno",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x116);
      abort();
    }
    iVar2 = pthread_join(t6.it_value.tv_nsec,(void **)0x0);
    if (iVar2 != 0) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
              "pthread_join(th2, NULL)",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x117);
      abort();
    }
    local_598 = (undefined1  [8])0x0;
    t7.it_interval.tv_sec = 200000000;
    t7.it_interval.tv_nsec = 0;
    t7.it_value.tv_sec = 500000000;
    piVar3 = __errno_location();
    *piVar3 = 0;
    pfd.fd = timerfd_settime(pfd._4_4_,0,(itimerspec *)local_598,(itimerspec *)0x0);
    if (pfd.fd < 0) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
              "timerfd_settime(fd, 0, &t7, NULL)",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x11c);
      abort();
    }
    piVar3 = __errno_location();
    if (*piVar3 != 0) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
              "timerfd_settime(fd, 0, &t7, NULL) errno",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x11c);
      abort();
    }
    tVar6 = steady_clock_now();
    sVar4 = read(pfd._4_4_,&t2.it_value.tv_nsec,8);
    if (sVar4 != 8) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(ssize_t)8",
              "read(fd, &counter, sizeof(counter))",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x11e);
      abort();
    }
    if (t2.it_value.tv_nsec != 1) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(u64)1","counter",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x11f);
      abort();
    }
    sVar4 = read(pfd._4_4_,&t2.it_value.tv_nsec,8);
    if (sVar4 != 8) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(ssize_t)8",
              "read(fd, &counter, sizeof(counter))",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x120);
      abort();
    }
    if (t2.it_value.tv_nsec != 1) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(u64)1","counter",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x121);
      abort();
    }
    tVar7 = steady_clock_now();
    iVar5 = nano_diff(tVar7,tVar6);
    if (iVar5 < 600000000) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(int64_t)MS_TO_NSEC(600)",
              "nano_diff(after, before)",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x123);
      abort();
    }
    tout.it_value.tv_nsec = 0;
    piVar3 = __errno_location();
    *piVar3 = 0;
    pfd.fd = timerfd_settime(pfd._4_4_,0,(itimerspec *)&tout.it_value.tv_nsec,(itimerspec *)0x0);
    if (pfd.fd < 0) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
              "timerfd_settime(fd, 0, &t8, NULL)",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x128);
      abort();
    }
    piVar3 = __errno_location();
    if (*piVar3 != 0) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
              "timerfd_settime(fd, 0, &t8, NULL) errno",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x128);
      abort();
    }
    piVar3 = __errno_location();
    *piVar3 = 0;
    pfd.fd = timerfd_gettime(pfd._4_4_,(itimerspec *)&t9.it_value.tv_nsec);
    if (pfd.fd < 0) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
              "timerfd_gettime(fd, &tout)",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,299);
      abort();
    }
    piVar3 = __errno_location();
    if (*piVar3 != 0) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
              "timerfd_gettime(fd, &tout) errno",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,299);
      abort();
    }
    if (t9.it_value.tv_nsec != tout.it_value.tv_nsec) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","t8.it_interval.tv_sec",
              "tout.it_interval.tv_sec",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,300);
      abort();
    }
    if (tout.it_interval.tv_sec != 400000000) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","t8.it_interval.tv_nsec",
              "tout.it_interval.tv_nsec",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x12d);
      abort();
    }
    if (tout.it_interval.tv_nsec != 0) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","t8.it_value.tv_sec",
              "tout.it_value.tv_sec",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x12e);
      abort();
    }
    if (300000000 < tout.it_value.tv_sec) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","tout.it_value.tv_nsec",
              "t8.it_value.tv_nsec",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x12f);
      abort();
    }
    if (tout.it_value.tv_sec < 200000000) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n",
              "t8.it_value.tv_nsec - (long)MS_TO_NSEC(100)","tout.it_value.tv_nsec",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x131);
      abort();
    }
    usleep(100000);
    piVar3 = __errno_location();
    *piVar3 = 0;
    pfd.fd = timerfd_gettime(pfd._4_4_,(itimerspec *)&t9.it_value.tv_nsec);
    if (pfd.fd < 0) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
              "timerfd_gettime(fd, &tout)",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x134);
      abort();
    }
    piVar3 = __errno_location();
    if (*piVar3 != 0) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
              "timerfd_gettime(fd, &tout) errno",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x134);
      abort();
    }
    if (t9.it_value.tv_nsec != tout.it_value.tv_nsec) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","t8.it_interval.tv_sec",
              "tout.it_interval.tv_sec",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x135);
      abort();
    }
    if (tout.it_interval.tv_sec != 400000000) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","t8.it_interval.tv_nsec",
              "tout.it_interval.tv_nsec",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x136);
      abort();
    }
    if (tout.it_interval.tv_nsec != 0) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","t8.it_value.tv_sec",
              "tout.it_value.tv_sec",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x137);
      abort();
    }
    if (200000000 < tout.it_value.tv_sec) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","tout.it_value.tv_nsec",
              "t8.it_value.tv_nsec - (long)MS_TO_NSEC(100)",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x139);
      abort();
    }
    if (tout.it_value.tv_sec < 100000000) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n",
              "t8.it_value.tv_nsec - (long)MS_TO_NSEC(200)","tout.it_value.tv_nsec",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x13c);
      abort();
    }
    usleep(300000);
    piVar3 = __errno_location();
    *piVar3 = 0;
    pfd.fd = timerfd_gettime(pfd._4_4_,(itimerspec *)&t9.it_value.tv_nsec);
    if (pfd.fd < 0) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
              "timerfd_gettime(fd, &tout)",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x140);
      abort();
    }
    piVar3 = __errno_location();
    if (*piVar3 != 0) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
              "timerfd_gettime(fd, &tout) errno",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x140);
      abort();
    }
    if (t9.it_value.tv_nsec != tout.it_value.tv_nsec) {
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","t8.it_interval.tv_sec",
              "tout.it_interval.tv_sec",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x141);
      abort();
    }
    if (tout.it_interval.tv_sec == 400000000) {
      if (tout.it_interval.tv_nsec != 0) {
        fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","t8.it_value.tv_sec",
                "tout.it_value.tv_sec",
                "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
                ,0x143);
        abort();
      }
      if (tout.it_value.tv_sec < 200000000) {
        fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(long)MS_TO_NSEC(200)",
                "tout.it_value.tv_nsec",
                "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
                ,0x145);
        abort();
      }
      if (400000000 < tout.it_value.tv_sec) {
        fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","tout.it_value.tv_nsec",
                "(long)MS_TO_NSEC(400)",
                "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
                ,0x146);
        abort();
      }
      local_618 = (undefined1  [8])0x0;
      t9.it_interval.tv_sec = 0;
      t9.it_interval.tv_nsec = 0;
      t9.it_value.tv_sec = 100000000;
      piVar3 = __errno_location();
      *piVar3 = 0;
      pfd.fd = timerfd_settime(pfd._4_4_,0,(itimerspec *)local_618,(itimerspec *)0x0);
      if (pfd.fd < 0) {
        fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
                "timerfd_settime(fd, 0, &t9, NULL)",
                "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
                ,0x14b);
        abort();
      }
      piVar3 = __errno_location();
      if (*piVar3 != 0) {
        fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
                "timerfd_settime(fd, 0, &t9, NULL) errno",
                "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
                ,0x14b);
        abort();
      }
      usleep(200000);
      piVar3 = __errno_location();
      *piVar3 = 0;
      pfd.fd = timerfd_gettime(pfd._4_4_,(itimerspec *)&t9.it_value.tv_nsec);
      if (pfd.fd < 0) {
        fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
                "timerfd_gettime(fd, &tout)",
                "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
                ,0x14d);
        abort();
      }
      piVar3 = __errno_location();
      if (*piVar3 != 0) {
        fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","0",
                "timerfd_gettime(fd, &tout) errno",
                "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
                ,0x14d);
        abort();
      }
      if (t9.it_value.tv_nsec == 0) {
        if (tout.it_interval.tv_sec != 0) {
          fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(long)0",
                  "tout.it_interval.tv_nsec",
                  "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
                  ,0x14f);
          abort();
        }
        if (tout.it_interval.tv_nsec == 0) {
          if (tout.it_value.tv_sec == 0) {
            return;
          }
          fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(long)0",
                  "tout.it_value.tv_nsec",
                  "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
                  ,0x151);
          abort();
        }
        fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(long)0",
                "tout.it_value.tv_sec",
                "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
                ,0x150);
        abort();
      }
      fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(long)0",
              "tout.it_interval.tv_sec",
              "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
              ,0x14e);
      abort();
    }
    fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","t8.it_interval.tv_nsec",
            "tout.it_interval.tv_nsec",
            "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
            ,0x142);
    abort();
  }
  fprintf(_stderr,"expecteds: %s, actuals: %s, file: %s, line: %d\n","(u64)1","counter",
          "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/tst-timerfd.c"
          ,0x10d);
  abort();
}

Assistant:

static void
dotest(int clockid)
{
	int fd;
	expect_success(fd, timerfd_create(clockid, TFD_NONBLOCK));
	int junk;

	// Before we set a timer, timerfd has no events for polling or reading
	struct pollfd pfd = { .fd = fd, .events = POLLIN };
	expect(poll(&pfd, 1, 0), 0);
	char buf[1024];
	expect_errno(read(fd, buf, sizeof(buf)), EAGAIN);
	// Reading less than 8 bytes result in an error
	expect_errno(read(fd, buf, 7), EINVAL);

	// Set a timer to expire in 500ms from now (relative time)
	struct itimerspec t1 = { { 0, 0 }, { 0, MS_TO_NSEC(500) } };
	expect_success(junk, timerfd_settime(fd, 0, &t1, NULL));
	// If we check now, the timer should have not yet expired
	expect_errno(read(fd, buf, sizeof(buf)), EAGAIN);
	// But if we sleep for a whole second, the timer would have expired and
	// read returns a counter of 1
	sleep(1);
	u64 counter;
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	expect_errno(read(fd, &counter, sizeof(counter)), EAGAIN);

	// Similarly, set a timer to expire in 300ms, and then again every
	// 200ms. After 400ms, poll sees the timer expired at least once, but
	// we do not read. After 400ms more, we read and see the timer expired
	// 3 times.
	struct itimerspec t2 = { { 0, MS_TO_NSEC(200) },
		{ 0, MS_TO_NSEC(300) } };
	expect_success(junk, timerfd_settime(fd, 0, &t2, NULL));
	expect_errno(read(fd, buf, sizeof(buf)), EAGAIN);
	expect(usleep(400000), 0);
#ifdef ALLOW_TIMER_SLACK
	expect(poll(&pfd, 1, -1), 1);
#else
	expect(poll(&pfd, 1, 0), 1);
#endif
	expect((int)pfd.revents, POLLIN);
	expect(usleep(400000), 0);
#ifdef ALLOW_TIMER_SLACK
	expect(poll(&pfd, 1, -1), 1);
#else
	expect(poll(&pfd, 1, 0), 1);
#endif
	expect((int)pfd.revents, POLLIN);
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expectge(counter, (u64)3);
#ifndef ALLOW_TIMER_SLACK
	expect(counter, (u64)3);
#endif
	expect_errno(read(fd, &counter, sizeof(counter)), EAGAIN);

	// If sleep (so counter becomes nonzero again) and then cancel the
	// timer, the counter remains zero
	usleep(400000);
	expect(poll(&pfd, 1, 0), 1); // counter is nonzero
	struct itimerspec t3 = { { 0, 0 }, { 0, 0 } };
	expect_success(junk, timerfd_settime(fd, 0, &t3, NULL));
	expect(poll(&pfd, 1, 0), 0); // counter is back to zero
	usleep(400000);
	expect(poll(&pfd, 1, 0), 0); // and timer was really canceled

	// Check absolute time setting
	// Set a timer to expire in 300ms from now (using absolute time)
	struct itimerspec t4 = { { 0, 0 }, { 0, 0 } };
	clock_gettime(clockid, &(t4.it_value));
	t4.it_value.tv_nsec += MS_TO_NSEC(300);
	if (t4.it_value.tv_nsec >= MS_TO_NSEC(1000)) {
		t4.it_value.tv_nsec -= MS_TO_NSEC(1000);
		t4.it_value.tv_sec++;
	}
	expect_success(junk, timerfd_settime(fd, TFD_TIMER_ABSTIME, &t4, NULL));
	expect_errno(read(fd, buf, sizeof(buf)), EAGAIN);
	usleep(500000);
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	expect_errno(read(fd, &counter, sizeof(counter)), EAGAIN);

	// Check blocking poll - simple case, no interval (see more complex
	// cases in blocking read tests below).
	struct itimerspec t45 = { { 0, 0 }, { 0, MS_TO_NSEC(400) } };
	expect_success(junk, timerfd_settime(fd, 0, &t45, NULL));
	struct timespec before = steady_clock_now();
	expect(poll(&pfd, 1, 0), 0);
	expect(poll(&pfd, 1, 100 /*ms*/), 0);
	expect(poll(&pfd, 1, 1000 /*ms*/), 1);
	struct timespec after = steady_clock_now();
	expectge(nano_diff(after, before), (int64_t)MS_TO_NSEC(300));

	// Check close
	expect_success(junk, close(fd));

	// Check that it's not a disaster to close an fd with a yet-unexpired
	// timer
	expect_success(fd, timerfd_create(CLOCK_REALTIME, 0));
	pfd.fd = fd;
	struct itimerspec t46 = { { 0, 0 }, { 10, 0 } };
	expect_success(junk, timerfd_settime(fd, 0, &t46, NULL));
	expect(poll(&pfd, 1, 0), 0);
	expect_success(junk, close(fd));

	// Open again with blocking read enabled
	expect_success(fd, timerfd_create(CLOCK_REALTIME, 0));
	pfd.fd = fd;

	// Check blocking read, no interval, timer set before read blocks
	struct itimerspec t5 = { { 0, 0 }, { 0, MS_TO_NSEC(500) } };
	expect_success(junk, timerfd_settime(fd, 0, &t5, NULL));
	before = steady_clock_now();
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	after = steady_clock_now();
	expectge(nano_diff(after, before), (int64_t)MS_TO_NSEC(400));

	// Check blocking read, no interval, timer set after read blocks
	pthread_t th2;
	expect(pthread_create(&th2, NULL, th2_func, &fd), 0);
	usleep(400000);
	struct itimerspec t6 = { { 0, 0 }, { 0, MS_TO_NSEC(200) } };
	expect_success(junk, timerfd_settime(fd, 0, &t6, NULL));
	expect(pthread_join(th2, NULL), 0);

	// Check blocking read, with interval
	struct itimerspec t7 = { { 0, MS_TO_NSEC(200) },
		{ 0, MS_TO_NSEC(500) } };
	expect_success(junk, timerfd_settime(fd, 0, &t7, NULL));
	before = steady_clock_now();
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	after = steady_clock_now();
	expectge(nano_diff(after, before), (int64_t)MS_TO_NSEC(600));

	// Check timerfd_gettime():
	struct itimerspec t8 = { { 0, MS_TO_NSEC(400) },
		{ 0, MS_TO_NSEC(300) } };
	expect_success(junk, timerfd_settime(fd, 0, &t8, NULL));
	struct itimerspec tout;
	// Right in the beginning:
	expect_success(junk, timerfd_gettime(fd, &tout));
	expect(tout.it_interval.tv_sec, t8.it_interval.tv_sec);
	expect(tout.it_interval.tv_nsec, t8.it_interval.tv_nsec);
	expect(tout.it_value.tv_sec, t8.it_value.tv_sec);
	expectge(t8.it_value.tv_nsec, tout.it_value.tv_nsec);
	expectge(tout.it_value.tv_nsec,
	    t8.it_value.tv_nsec - (long)MS_TO_NSEC(100));
	// After a while but before expiration:
	usleep(100000);
	expect_success(junk, timerfd_gettime(fd, &tout));
	expect(tout.it_interval.tv_sec, t8.it_interval.tv_sec);
	expect(tout.it_interval.tv_nsec, t8.it_interval.tv_nsec);
	expect(tout.it_value.tv_sec, t8.it_value.tv_sec);
	expectge(t8.it_value.tv_nsec - (long)MS_TO_NSEC(100),
	    tout.it_value.tv_nsec);
#ifndef ALLOW_TIMER_SLACK
	expectge(tout.it_value.tv_nsec,
	    t8.it_value.tv_nsec - (long)MS_TO_NSEC(200));
#endif
	// After expiration, we have the interval
	usleep(300000);
	expect_success(junk, timerfd_gettime(fd, &tout));
	expect(tout.it_interval.tv_sec, t8.it_interval.tv_sec);
	expect(tout.it_interval.tv_nsec, t8.it_interval.tv_nsec);
	expect(tout.it_value.tv_sec, t8.it_value.tv_sec);
#ifndef ALLOW_TIMER_SLACK
	expectge(tout.it_value.tv_nsec, (long)MS_TO_NSEC(200));
	expectge((long)MS_TO_NSEC(400), tout.it_value.tv_nsec);
#endif

	// Check timerfd_gettime() after expiration of a single-time timer:
	struct itimerspec t9 = { { 0, 0 }, { 0, MS_TO_NSEC(100) } };
	expect_success(junk, timerfd_settime(fd, 0, &t9, NULL));
	usleep(200000);
	expect_success(junk, timerfd_gettime(fd, &tout));
	expect(tout.it_interval.tv_sec, (long)0);
	expect(tout.it_interval.tv_nsec, (long)0);
	expect(tout.it_value.tv_sec, (long)0);
	expect(tout.it_value.tv_nsec, (long)0);
	expect(tout.it_value.tv_nsec, (long)0);
}